

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O1

size_t HUF_compressCTable_internal
                 (BYTE *ostart,BYTE *op,BYTE *oend,void *src,size_t srcSize,
                 HUF_nbStreams_e nbStreams,HUF_CElt *CTable,int bmi2)

{
  BYTE *pBVar1;
  BYTE *pBVar2;
  
  if (nbStreams == HUF_singleStream) {
    pBVar1 = (BYTE *)HUF_compress1X_usingCTable_internal
                               (op,(long)oend - (long)op,src,srcSize,CTable,0);
  }
  else {
    pBVar1 = (BYTE *)HUF_compress4X_usingCTable_internal
                               (op,(long)oend - (long)op,src,srcSize,CTable,nbStreams);
  }
  pBVar2 = pBVar1;
  if (pBVar1 < (BYTE *)0xffffffffffffff89) {
    if (pBVar1 == (BYTE *)0x0) {
      pBVar2 = (BYTE *)0x0;
    }
    else {
      pBVar2 = (BYTE *)0x0;
      if (op + ((long)pBVar1 - (long)ostart) < (BYTE *)(srcSize - 1)) {
        pBVar2 = op + ((long)pBVar1 - (long)ostart);
      }
    }
  }
  return (size_t)pBVar2;
}

Assistant:

static size_t HUF_compressCTable_internal(
                BYTE* const ostart, BYTE* op, BYTE* const oend,
                const void* src, size_t srcSize,
                HUF_nbStreams_e nbStreams, const HUF_CElt* CTable, const int bmi2)
{
    size_t const cSize = (nbStreams==HUF_singleStream) ?
                         HUF_compress1X_usingCTable_internal(op, (size_t)(oend - op), src, srcSize, CTable, bmi2) :
                         HUF_compress4X_usingCTable_internal(op, (size_t)(oend - op), src, srcSize, CTable, bmi2);
    if (HUF_isError(cSize)) { return cSize; }
    if (cSize==0) { return 0; }   /* uncompressible */
    op += cSize;
    /* check compressibility */
    assert(op >= ostart);
    if ((size_t)(op-ostart) >= srcSize-1) { return 0; }
    return (size_t)(op-ostart);
}